

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteStmt.cpp
# Opt level: O0

SQLiteSelect * __thiscall hiberlite::SQLiteSelect::get_name_abi_cxx11_(SQLiteSelect *this,int N)

{
  runtime_error *this_00;
  statement_ptr *this_01;
  sqlite3_stmt *pStmt;
  char *pcVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  allocator local_2d [17];
  int local_1c;
  long lStack_18;
  int N_local;
  SQLiteSelect *this_local;
  
  lStack_18 = CONCAT44(in_register_00000034,N);
  this_local = this;
  if ((*(byte *)(lStack_18 + 8) & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"step() was not called before column access");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c = in_EDX;
  this_01 = shared_res<hiberlite::statement_ptr>::operator->
                      ((shared_res<hiberlite::statement_ptr> *)(lStack_18 + 0x10));
  pStmt = statement_ptr::get_stmt(this_01);
  pcVar1 = sqlite3_column_name(pStmt,local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  return this;
}

Assistant:

std::string SQLiteSelect::get_name(int N){
	if(!active)
		throw std::runtime_error("step() was not called before column access");
	return sqlite3_column_name(statement->get_stmt(), N);
}